

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_printf(roaring_bitmap_t *r)

{
  long lVar1;
  
  putchar(0x7b);
  if (0 < (r->high_low_container).size) {
    lVar1 = 0;
    do {
      container_printf_as_uint32_array
                ((r->high_low_container).containers[lVar1],(r->high_low_container).typecodes[lVar1],
                 (uint)(r->high_low_container).keys[lVar1] << 0x10);
      lVar1 = lVar1 + 1;
      if (lVar1 < (r->high_low_container).size) {
        putchar(0x2c);
      }
    } while (lVar1 < (r->high_low_container).size);
  }
  putchar(0x7d);
  return;
}

Assistant:

void roaring_bitmap_printf(const roaring_bitmap_t *r) {
    const roaring_array_t *ra = &r->high_low_container;

    printf("{");
    for (int i = 0; i < ra->size; ++i) {
        container_printf_as_uint32_array(ra->containers[i], ra->typecodes[i],
                                         ((uint32_t)ra->keys[i]) << 16);

        if (i + 1 < ra->size) {
            printf(",");
        }
    }
    printf("}");
}